

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::discard
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this,unsigned_long_long n)

{
  GF2 a;
  type_conflict4 tVar1;
  unsigned_long_long uVar2;
  reference pvVar3;
  reference pvVar4;
  ulong in_RSI;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *in_RDI;
  unsigned_long_long i_4;
  size_type i_3;
  size_type k;
  result_type_conflict sum;
  size_type i_2;
  vector_type W;
  size_type i_1;
  vector_type V;
  size_type i;
  matrix_type M;
  unsigned_long_long n_partial;
  uint mask;
  unsigned_long_long n_pivot;
  uint matrix_size;
  matrix<trng::GF2,_521UL> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffef0;
  value_type in_stack_fffffffffffffef4;
  ulong local_e8;
  ulong local_e0;
  unsigned_long_long in_stack_ffffffffffffff30;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar6;
  ulong local_c0;
  ulong local_a0;
  GF2 local_68;
  GF2 local_67;
  GF2 local_66;
  GF2 local_65 [20];
  GF2 local_51;
  ulong local_50;
  long local_30;
  undefined4 local_24;
  ulong local_20;
  undefined4 local_14;
  ulong local_10;
  
  local_14 = 0x209;
  local_10 = in_RSI;
  uVar2 = int_math::log2_ceil<unsigned_long_long>
                    (CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_20 = uVar2 * 0x86de8d9;
  local_24 = 0x3ff;
  if (local_20 < local_10) {
    local_30 = local_10 - 0x209;
    matrix<trng::GF2,_521UL>::matrix
              ((matrix<trng::GF2,_521UL> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_50 = 0; local_50 < 0x208; local_50 = local_50 + 1) {
      GF2::GF2(&local_51,true);
      pvVar3 = matrix<trng::GF2,_521UL>::operator()
                         ((matrix<trng::GF2,_521UL> *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (size_type)in_stack_fffffffffffffec8,0x2d29dc);
      pvVar3->value = local_51.value;
    }
    GF2::GF2(local_65,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       ((matrix<trng::GF2,_521UL> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (size_type)in_stack_fffffffffffffec8,0x2d2a3e);
    pvVar3->value = local_65[0].value;
    GF2::GF2(&local_66,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       ((matrix<trng::GF2,_521UL> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (size_type)in_stack_fffffffffffffec8,0x2d2a72);
    pvVar3->value = local_66.value;
    GF2::GF2(&local_67,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       ((matrix<trng::GF2,_521UL> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (size_type)in_stack_fffffffffffffec8,0x2d2aa6);
    pvVar3->value = local_67.value;
    GF2::GF2(&local_68,true);
    pvVar3 = matrix<trng::GF2,_521UL>::operator()
                       ((matrix<trng::GF2,_521UL> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (size_type)in_stack_fffffffffffffec8,0x2d2adf);
    pvVar3->value = local_68.value;
    power<trng::GF2,521ul>
              ((matrix<trng::GF2,_521UL> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff30);
    matrix<trng::GF2,_521UL>::operator=
              ((matrix<trng::GF2,_521UL> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2d2b28);
    vector<unsigned_int,_521UL>::vector
              ((vector<unsigned_int,_521UL> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_a0 = 0; local_a0 < 0x209; local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffef4 = (in_RDI->S).r[(in_RDI->S).index - (int)local_a0 & 0x3ff];
      pvVar4 = vector<unsigned_int,_521UL>::operator()
                         ((vector<unsigned_int,_521UL> *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (size_type)in_stack_fffffffffffffec8);
      *pvVar4 = in_stack_fffffffffffffef4;
    }
    vector<unsigned_int,_521UL>::vector
              ((vector<unsigned_int,_521UL> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    for (local_c0 = 0; local_c0 < 0x209; local_c0 = local_c0 + 1) {
      uVar6 = 0;
      for (uVar5 = 0; uVar5 < 0x209; uVar5 = uVar5 + 1) {
        pvVar3 = matrix<trng::GF2,_521UL>::operator()
                           ((matrix<trng::GF2,_521UL> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (size_type)in_stack_fffffffffffffec8,0x2d2c29);
        a.value = pvVar3->value;
        pvVar4 = vector<unsigned_int,_521UL>::operator()
                           ((vector<unsigned_int,_521UL> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (size_type)in_stack_fffffffffffffec8);
        tVar1 = trng::operator*(a,*pvVar4);
        uVar6 = tVar1 ^ uVar6;
      }
      pvVar4 = vector<unsigned_int,_521UL>::operator()
                         ((vector<unsigned_int,_521UL> *)CONCAT44(uVar6,in_stack_fffffffffffffed0),
                          (size_type)in_stack_fffffffffffffec8);
      *pvVar4 = uVar6;
      in_stack_fffffffffffffed4 = uVar6;
    }
    (in_RDI->S).index = (in_RDI->S).index + (int)local_30;
    (in_RDI->S).index = (in_RDI->S).index & 0x3ff;
    for (local_e0 = 0; local_e0 < 0x209; local_e0 = local_e0 + 1) {
      in_stack_fffffffffffffec8 =
           (matrix<trng::GF2,_521UL> *)
           vector<unsigned_int,_521UL>::operator()
                     ((vector<unsigned_int,_521UL> *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (size_type)in_stack_fffffffffffffec8);
      (in_RDI->S).r[(in_RDI->S).index - local_e0 & 0x3ff] =
           *(value_type *)
            &(in_stack_fffffffffffffec8->data).
             super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
    local_10 = local_10 - local_30;
    vector<unsigned_int,_521UL>::~vector((vector<unsigned_int,_521UL> *)0x2d2d97);
    vector<unsigned_int,_521UL>::~vector((vector<unsigned_int,_521UL> *)0x2d2da4);
    matrix<trng::GF2,_521UL>::~matrix((matrix<trng::GF2,_521UL> *)0x2d2db1);
  }
  for (local_e8 = 0; local_e8 < local_10; local_e8 = local_e8 + 1) {
    step(in_RDI);
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = D;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * D * D * D};
      constexpr auto mask = int_math::mask(D);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - D) = GF2(true);
        M(matrix_size - 1, matrix_size - C) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }